

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::push_back(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
            *this,rvalue_reference v)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  Rep *pRVar5;
  ulong uVar6;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  uVar4 = uVar2 >> 1;
  uVar6 = 2;
  if ((uVar2 & 1) != 0) {
    uVar6 = *(ulong *)&this->rep_;
  }
  pRVar5 = &this->rep_;
  if (uVar6 < uVar4) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::emplace_back(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
                 );
  }
  if (uVar4 == uVar6) {
    GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>(this,v);
    return;
  }
  if (uVar4 < uVar6) {
    if ((uVar2 & 1) != 0) {
      pRVar5 = *(Rep **)((long)&this->rep_ + 8);
    }
    (this->allocator_and_tag_).tag_.size_ = uVar2 + 2;
    uVar3 = *(undefined8 *)&v->outgoing;
    puVar1 = (undefined8 *)((long)pRVar5 + uVar4 * 0x10);
    *puVar1 = *(undefined8 *)v;
    puVar1[1] = uVar3;
    return;
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::emplace_back(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

void push_back(rvalue_reference v) {
    static_cast<void>(emplace_back(std::move(v)));
  }